

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void init_mv_cost_params(MV_COST_PARAMS *mv_cost_params,MvCosts *mv_costs,MV *ref_mv,int errorperbit
                        ,int sadperbit)

{
  mv_cost_params->ref_mv = ref_mv;
  mv_cost_params->full_ref_mv =
       (FULLPEL_MV)
       (((int)ref_mv->row - (~(int)ref_mv->row >> 0x1f)) + 3U >> 3 & 0xffff |
       ((int)ref_mv->col - (~(int)ref_mv->col >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000);
  mv_cost_params->mv_cost_type = '\0';
  mv_cost_params->error_per_bit = errorperbit;
  mv_cost_params->sad_per_bit = sadperbit;
  if (mv_costs != (MvCosts *)0x0) {
    mv_cost_params->mvjcost = mv_costs->nmv_joint_cost;
    mv_cost_params->mvcost[0] = *mv_costs->mv_cost_stack;
    mv_cost_params->mvcost[1] = mv_costs->mv_cost_stack[1];
  }
  return;
}

Assistant:

static inline void init_mv_cost_params(MV_COST_PARAMS *mv_cost_params,
                                       const MvCosts *mv_costs,
                                       const MV *ref_mv, int errorperbit,
                                       int sadperbit) {
  mv_cost_params->ref_mv = ref_mv;
  mv_cost_params->full_ref_mv = get_fullmv_from_mv(ref_mv);
  mv_cost_params->mv_cost_type = MV_COST_ENTROPY;
  mv_cost_params->error_per_bit = errorperbit;
  mv_cost_params->sad_per_bit = sadperbit;
  // For allintra encoding mode, 'mv_costs' is not allocated. Hence, the
  // population of mvjcost and mvcost are avoided. In case of IntraBC, these
  // values are populated from 'dv_costs' in av1_set_ms_to_intra_mode().
  if (mv_costs != NULL) {
    mv_cost_params->mvjcost = mv_costs->nmv_joint_cost;
    mv_cost_params->mvcost[0] = mv_costs->mv_cost_stack[0];
    mv_cost_params->mvcost[1] = mv_costs->mv_cost_stack[1];
  }
}